

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibrary.cpp
# Opt level: O3

void __thiscall Jinx::Impl::Library::SetProperty(Library *this,String *name,Variant *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Runtime *this_01;
  int iVar1;
  _Atomic_word _Var2;
  iterator iVar3;
  bool bVar4;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_propertyMutex);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_>,_Jinx::StaticAllocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::Impl::PropertyName>,_4096UL,_16UL>_>
          ::find(&(this->m_propertyNameTable)._M_t,name);
  if (((_Rb_tree_header *)iVar3._M_node !=
       &(this->m_propertyNameTable)._M_t._M_impl.super__Rb_tree_header) &&
     (this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                (this->m_runtime).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi, this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0))
  {
    _Var2 = this_00->_M_use_count;
    do {
      if (_Var2 == 0) goto LAB_001fa02e;
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar4 = _Var2 == iVar1;
      if (bVar4) {
        this_00->_M_use_count = _Var2 + 1;
        iVar1 = _Var2;
      }
      _Var2 = iVar1;
      UNLOCK();
    } while (!bVar4);
    this_01 = (this->m_runtime).super___weak_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
    if (this_01 != (Runtime *)0x0 && this_00->_M_use_count != 0) {
      Runtime::SetProperty(this_01,*(RuntimeID *)(iVar3._M_node + 2),value);
    }
    Catch::clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
LAB_001fa02e:
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_propertyMutex);
  return;
}

Assistant:

inline_t void Library::SetProperty(const String & name, const Variant & value)
	{
		std::lock_guard<std::mutex> lock(m_propertyMutex);
		auto itr = m_propertyNameTable.find(name);
		if (itr == m_propertyNameTable.end())
			return;
		auto runtime = m_runtime.lock();
		if (!runtime)
			return;
		runtime->SetProperty(itr->second.GetId(), value);
	}